

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

bool __thiscall
QFSFileEnginePrivate::nativeOpen
          (QFSFileEnginePrivate *this,OpenMode openMode,
          optional<QFlags<QFileDevice::Permission>_> permissions)

{
  bool bVar1;
  long in_FS_OFFSET;
  QFSFileEnginePrivate *in_stack_00000018;
  OpenMode in_stack_0000009c;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<QFlags<QFileDevice::Permission>_> *)0x17db60);
  if (bVar1) {
    std::optional<QFlags<QFileDevice::Permission>_>::operator*
              ((optional<QFlags<QFileDevice::Permission>_> *)0x17db70);
    QtPrivate::toMode_t((QFlagsStorageHelper<QFileDevice::Permission,_4>)
                        SUB84((ulong)lVar2 >> 0x20,0));
  }
  bVar1 = nativeOpenImpl(in_stack_00000018,in_stack_0000009c,this._4_4_);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QFSFileEnginePrivate::nativeOpen(QIODevice::OpenMode openMode,
                                      std::optional<QFile::Permissions> permissions)
{
    return nativeOpenImpl(openMode, permissions ? QtPrivate::toMode_t(*permissions) : 0666);
}